

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
gtl::
dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
::maybe_shrink(dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
               *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong new_num_buckets;
  bool bVar4;
  
  uVar2 = this->num_elements - this->num_deleted;
  if (this->num_elements < this->num_deleted) {
    __assert_fail("num_elements >= num_deleted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x255,
                  "bool gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::maybe_shrink() [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>]"
                 );
  }
  uVar1 = this->num_buckets;
  if ((uVar1 & uVar1 - 1) != 0) {
    __assert_fail("(bucket_count() & (bucket_count()-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x256,
                  "bool gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::maybe_shrink() [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>]"
                 );
  }
  if (uVar1 < 4) {
    __assert_fail("bucket_count() >= HT_MIN_BUCKETS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,599,
                  "bool gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::maybe_shrink() [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>]"
                 );
  }
  bVar4 = uVar2 < (this->settings).
                  super_sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
                  .shrink_threshold_;
  if (0x20 < uVar1 && bVar4) {
    uVar3 = uVar1;
    do {
      new_num_buckets = uVar3 >> 1;
      if (uVar3 < 0x42) break;
      uVar3 = new_num_buckets;
    } while ((float)uVar2 <
             (float)new_num_buckets *
             (this->settings).
             super_sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
             .shrink_factor_);
    rebucket(this,new_num_buckets);
  }
  (this->settings).
  super_sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
  .consider_shrink_ = false;
  return 0x20 < uVar1 && bVar4;
}

Assistant:

bool maybe_shrink() {
    assert(num_elements >= num_deleted);
    assert((bucket_count() & (bucket_count()-1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = num_elements - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;    // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < sz * shrink_factor) {
        sz /= 2;                            // stay a power of 2
      }
      rebucket(sz);
      retval = true;
    }
    settings.set_consider_shrink(false);    // because we just considered it
    return retval;
  }